

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

uint32_t xray_re::xr_file_system::file_age(char *path)

{
  int iVar1;
  path *this;
  value_type_conflict *__file;
  CPath local_d0;
  undefined1 local_a8 [8];
  stat st;
  char *path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  CPath::CPath(&local_d0,path);
  this = CPath::make_preferred_abi_cxx11_(&local_d0);
  __file = std::filesystem::__cxx11::path::c_str(this);
  iVar1 = stat(__file,(stat *)local_a8);
  CPath::~CPath(&local_d0);
  if (iVar1 == 0) {
    path_local._4_4_ = (uint32_t)st.st_atim.tv_nsec;
  }
  else {
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

uint32_t xr_file_system::file_age(const char* path)
{
struct stat st;

	if(stat(CPath(path).make_preferred().c_str(), &st) == 0)
		return uint32_t(st.st_mtime);

	return 0;
}